

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void av1_warp_affine_avx2
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  undefined1 (*pauVar1) [16];
  WarpedFilterCoeff aWVar2 [8];
  __m256i alVar3;
  int iVar4;
  __m256i src;
  __m256i src_00;
  __m256i src_01;
  __m256i src_02;
  __m256i src_03;
  __m256i src_04;
  __m256i src_05;
  __m256i src_06;
  byte bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  byte bVar10;
  int iVar11;
  int iVar12;
  int j;
  int iVar13;
  int i;
  char cVar14;
  undefined4 in_register_00000014;
  int iVar15;
  int iVar16;
  int iVar17;
  __m256i *palVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  uint uVar22;
  int alpha_00;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  undefined2 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  __m128i shift;
  __m256i coeff [4];
  __m256i round_const;
  __m256i wt;
  __m256i round_bits_const;
  __m256i res_sub_const;
  __m256i horz_out [8];
  __m256i res_lo;
  __m256i shuffle_src [4];
  __m256i coeffs [8];
  undefined4 in_stack_fffffffffffff960;
  int iVar65;
  __m256i *round_const_00;
  undefined4 in_stack_fffffffffffff978;
  int iVar66;
  __m128i local_630;
  undefined1 local_620 [32];
  uint8_t (*local_600) [16];
  ulong local_5f8;
  ulong local_5f0;
  ulong local_5e8;
  uint8_t *local_5e0;
  ulong local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  uint local_5ac;
  undefined8 local_5a8;
  uint8_t (*local_5a0) [16];
  ulong local_598;
  ulong local_590;
  ulong local_588;
  ulong local_580;
  ulong local_578;
  ulong local_570;
  ulong local_568;
  __m256i local_560;
  undefined1 local_540 [32];
  __m256i local_520;
  undefined1 local_500 [32];
  __m256i local_4e0;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  longlong lStack_488;
  undefined1 local_480 [32];
  undefined2 local_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined2 uStack_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined2 uStack_450;
  undefined2 uStack_44e;
  undefined2 uStack_44c;
  undefined2 uStack_44a;
  undefined2 uStack_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  uint8_t *local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  ulong local_418;
  ulong local_410;
  ulong local_408;
  ulong local_400;
  ulong local_3f8;
  long local_3f0;
  int *local_3e8;
  long local_3e0;
  ulong local_3d8;
  ulong local_3d0;
  ulong local_3c8;
  ulong local_3c0;
  ulong local_3b8;
  ulong local_3b0;
  ulong local_3a8;
  int local_3a0;
  int iStack_39c;
  int iStack_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  int iStack_388;
  int iStack_384;
  __m256i local_380;
  undefined2 local_360;
  undefined2 uStack_35e;
  undefined2 uStack_35c;
  undefined2 uStack_35a;
  undefined2 uStack_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 uStack_350;
  undefined2 uStack_34e;
  undefined2 uStack_34c;
  undefined2 uStack_34a;
  undefined2 uStack_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 local_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined2 uStack_33a;
  undefined2 uStack_338;
  undefined2 uStack_336;
  undefined2 uStack_334;
  undefined2 uStack_332;
  undefined2 uStack_330;
  undefined2 uStack_32e;
  undefined2 uStack_32c;
  undefined2 uStack_32a;
  undefined2 uStack_328;
  undefined2 uStack_326;
  undefined2 uStack_324;
  undefined2 uStack_322;
  __m256i local_320;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  longlong local_220 [4];
  longlong local_200 [4];
  longlong local_1e0 [12];
  undefined1 local_180 [32];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  local_5a8 = CONCAT44(in_register_00000014,width);
  uVar23 = conv_params->round_0;
  if (conv_params->is_compound == 0) {
    uVar27 = 0xe - uVar23;
    uVar26 = conv_params->round_1;
  }
  else {
    uVar26 = conv_params->round_1;
    uVar27 = uVar26;
  }
  local_5f0 = (ulong)uVar27;
  bVar5 = (byte)uVar23;
  uVar22 = (0xe - uVar23) - uVar26;
  local_5e8 = (ulong)uVar22;
  bVar10 = (0x16 - bVar5) - (char)uVar26;
  local_460 = (undefined2)(((uint)(1 << (bVar5 & 0x1f)) >> 1) + 0x4000);
  local_630 = (__m128i)ZEXT416(uVar23);
  local_340 = (undefined2)((-1 << (bVar10 - 1 & 0x1f)) + (-1 << (bVar10 & 0x1f)));
  local_360 = (undefined2)((uint)(1 << ((byte)uVar22 & 0x1f)) >> 1);
  uVar32 = (undefined2)conv_params->fwd_offset;
  auVar34._2_2_ = uVar32;
  auVar34._0_2_ = uVar32;
  auVar34._4_2_ = uVar32;
  auVar34._6_2_ = uVar32;
  auVar34._8_2_ = uVar32;
  auVar34._10_2_ = uVar32;
  auVar34._12_2_ = uVar32;
  auVar34._14_2_ = uVar32;
  auVar34._16_2_ = uVar32;
  auVar34._18_2_ = uVar32;
  auVar34._20_2_ = uVar32;
  auVar34._22_2_ = uVar32;
  auVar34._24_2_ = uVar32;
  auVar34._26_2_ = uVar32;
  auVar34._28_2_ = uVar32;
  auVar34._30_2_ = uVar32;
  uVar32 = (undefined2)conv_params->bck_offset;
  auVar40._2_2_ = uVar32;
  auVar40._0_2_ = uVar32;
  auVar40._4_2_ = uVar32;
  auVar40._6_2_ = uVar32;
  auVar40._8_2_ = uVar32;
  auVar40._10_2_ = uVar32;
  auVar40._12_2_ = uVar32;
  auVar40._14_2_ = uVar32;
  auVar40._16_2_ = uVar32;
  auVar40._18_2_ = uVar32;
  auVar40._20_2_ = uVar32;
  auVar40._22_2_ = uVar32;
  auVar40._24_2_ = uVar32;
  auVar40._26_2_ = uVar32;
  auVar40._28_2_ = uVar32;
  auVar40._30_2_ = uVar32;
  local_380 = (__m256i)vpunpcklwd_avx2(auVar34,auVar40);
  if (conv_params->is_compound == 1) {
    local_3a0 = 1 << (0x16 - bVar5 & 0x1f);
  }
  else {
    local_3a0 = -1 << ((byte)uVar27 + 7 & 0x1f);
  }
  local_3a0 = ((1 << ((byte)uVar27 & 0x1f)) >> 1) + local_3a0;
  alpha_00 = (int)alpha;
  uVar23 = (uint)beta;
  local_5f8 = (ulong)uVar23;
  local_5b8 = (uVar23 + alpha_00) * 4;
  uVar26 = (uint)gamma;
  local_568 = (ulong)uVar26;
  uVar27 = (uint)delta;
  local_5c8 = (ulong)uVar27;
  local_5d0 = (ulong)(p_col + 4);
  local_5d8 = (ulong)(p_row + 4);
  iVar29 = height + -1;
  iVar30 = (0x10000 << (0xe - bVar5 & 0x1f)) >> 0x10;
  iVar6 = (0x10000 << (7 - bVar5 & 0x1f)) >> 0x10;
  local_5bc = (int)(short)(beta | alpha);
  cVar14 = alpha == 0 && beta != 0;
  cVar20 = alpha != 0 && beta == 0;
  local_3f8 = (ulong)(uint)(alpha_00 * 6);
  local_5c0 = alpha_00 * 7;
  local_5ac = (uint)(ushort)(delta | gamma);
  iVar15 = uVar23 * -3 + 0x10200;
  cVar19 = gamma == 0 && delta != 0;
  cVar21 = gamma != 0 && delta == 0;
  local_1e0[0] = 0x806060404020200;
  local_1e0[1] = 0x907070505030301;
  local_1e0[2] = 0x806060404020200;
  local_1e0[3] = 0x907070505030301;
  local_1e0[4] = 0xc0a0a0808060604;
  local_1e0[5] = 0xd0b0b0909070705;
  local_1e0[6] = 0xc0a0a0808060604;
  local_1e0[7] = 0xd0b0b0909070705;
  local_1e0[8] = 0x907070505030301;
  local_1e0[9] = 0xa08080606040402;
  local_1e0[10] = 0x907070505030301;
  local_1e0[0xb] = 0xa08080606040402;
  local_180._16_16_ = _DAT_004cbcc0;
  local_180._0_16_ = _DAT_004cbcc0;
  local_3a8 = (ulong)(uVar27 + uVar26);
  local_5b0 = (uVar27 + uVar26) * 4;
  local_5b4 = width + 6;
  iVar7 = width + -1;
  local_400 = (ulong)(uint)(alpha_00 * 2);
  local_408 = (ulong)(uint)(alpha_00 * 3);
  local_410 = (ulong)(uint)(alpha_00 * 4);
  local_418 = (ulong)(uint)(alpha_00 * 5);
  local_570 = (ulong)(uVar26 * 2);
  local_578 = (ulong)(uVar26 * 4);
  local_580 = (ulong)(uVar26 * 6);
  local_588 = (ulong)(uVar26 * 3);
  local_590 = (ulong)(uVar26 * 5);
  local_598 = (ulong)(uVar26 * 7);
  iVar4 = uVar23 * 2;
  local_3b0 = (ulong)(uVar26 * 7 + uVar27);
  local_3b8 = (ulong)(uVar26 * 5 + uVar27);
  local_3c0 = (ulong)(uVar26 * 3 + uVar27);
  local_3c8 = (ulong)(uVar26 * 6 + uVar27);
  local_3d0 = (ulong)(uVar27 + uVar26 * 4);
  local_3d8 = (ulong)(uVar27 + uVar26 * 2);
  i = 0;
  palVar18 = (__m256i *)ref;
  iVar31 = stride;
  round_const_00 = (__m256i *)ref;
  iVar66 = iVar29;
  local_5e0 = pred;
  uStack_45e = local_460;
  uStack_45c = local_460;
  uStack_45a = local_460;
  uStack_458 = local_460;
  uStack_456 = local_460;
  uStack_454 = local_460;
  uStack_452 = local_460;
  uStack_450 = local_460;
  uStack_44e = local_460;
  uStack_44c = local_460;
  uStack_44a = local_460;
  uStack_448 = local_460;
  uStack_446 = local_460;
  uStack_444 = local_460;
  uStack_442 = local_460;
  local_3e8 = mat;
  iStack_39c = local_3a0;
  iStack_398 = local_3a0;
  iStack_394 = local_3a0;
  iStack_390 = local_3a0;
  iStack_38c = local_3a0;
  iStack_388 = local_3a0;
  iStack_384 = local_3a0;
  uStack_35e = local_360;
  uStack_35c = local_360;
  uStack_35a = local_360;
  uStack_358 = local_360;
  uStack_356 = local_360;
  uStack_354 = local_360;
  uStack_352 = local_360;
  uStack_350 = local_360;
  uStack_34e = local_360;
  uStack_34c = local_360;
  uStack_34a = local_360;
  uStack_348 = local_360;
  uStack_346 = local_360;
  uStack_344 = local_360;
  uStack_342 = local_360;
  uStack_33e = local_340;
  uStack_33c = local_340;
  uStack_33a = local_340;
  uStack_338 = local_340;
  uStack_336 = local_340;
  uStack_334 = local_340;
  uStack_332 = local_340;
  uStack_330 = local_340;
  uStack_32e = local_340;
  uStack_32c = local_340;
  uStack_32a = local_340;
  uStack_328 = local_340;
  uStack_326 = local_340;
  uStack_324 = local_340;
  uStack_322 = local_340;
  do {
    iVar28 = p_height - i;
    if (iVar28 == 0 || p_height < i) {
      return;
    }
    if (7 < iVar28) {
      iVar28 = 8;
    }
    local_3e0 = (long)((int)local_5d8 + i << ((byte)subsampling_y & 0x1f));
    iVar65 = iVar28 + -2;
    iVar28 = iVar28 + -4;
    for (j = 0; j < p_width; j = j + 8) {
      lVar8 = (long)((int)local_5d0 + j << ((byte)subsampling_x & 0x1f));
      uVar25 = (long)*local_3e8 + local_3e8[3] * local_3e0 + local_3e8[2] * lVar8 >>
               ((byte)subsampling_x & 0x3f);
      lVar8 = (long)local_3e8[1] + local_3e8[5] * local_3e0 + local_3e8[4] * lVar8 >>
              ((byte)subsampling_y & 0x3f);
      uVar23 = (uint)(uVar25 >> 0x10);
      iVar16 = (int)((ulong)lVar8 >> 0x10);
      iVar17 = 0;
      if ((int)uVar23 < -6) {
        iVar16 = iVar16 + -7;
        pauVar9 = (undefined1 (*) [32])local_320;
        iVar11 = -7;
        while( true ) {
          iVar24 = iVar29;
          if (iVar16 < iVar29) {
            iVar24 = iVar16;
          }
          if (iVar16 < 0) {
            iVar24 = iVar17;
          }
          bVar10 = *(byte *)((long)*palVar18 + (long)(iVar24 * stride));
          if (iVar65 < iVar11) break;
          iVar24 = iVar16 + 1;
          if (iVar29 <= iVar16 + 1) {
            iVar24 = iVar29;
          }
          uVar32 = (undefined2)((uint)bVar10 * iVar6 + iVar30);
          if (iVar16 < -1) {
            iVar24 = iVar17;
          }
          auVar41._0_2_ =
               (undefined2)
               ((uint)*(byte *)((long)*palVar18 + (long)(iVar24 * stride)) * iVar6 + iVar30);
          auVar41._2_2_ = auVar41._0_2_;
          auVar41._4_2_ = auVar41._0_2_;
          auVar41._6_2_ = auVar41._0_2_;
          auVar41._8_2_ = auVar41._0_2_;
          auVar41._10_2_ = auVar41._0_2_;
          auVar41._12_2_ = auVar41._0_2_;
          auVar41._14_2_ = auVar41._0_2_;
          auVar41._16_2_ = auVar41._0_2_;
          auVar41._18_2_ = auVar41._0_2_;
          auVar41._20_2_ = auVar41._0_2_;
          auVar41._22_2_ = auVar41._0_2_;
          auVar41._24_2_ = auVar41._0_2_;
          auVar41._26_2_ = auVar41._0_2_;
          auVar41._28_2_ = auVar41._0_2_;
          auVar41._30_2_ = auVar41._0_2_;
          auVar34 = vpblendd_avx2(ZEXT1632(CONCAT214(uVar32,CONCAT212(uVar32,CONCAT210(uVar32,
                                                  CONCAT28(uVar32,CONCAT26(uVar32,CONCAT24(uVar32,
                                                  CONCAT22(uVar32,uVar32)))))))),auVar41,0xf0);
          *pauVar9 = auVar34;
          iVar11 = iVar11 + 2;
          pauVar9 = pauVar9 + 1;
          iVar16 = iVar16 + 2;
        }
LAB_003d57ac:
        uVar32 = (undefined2)(((uint)bVar10 << (7 - bVar5 & 0x1f)) + (1 << (0xe - bVar5 & 0x1f)));
        *(undefined2 *)*pauVar9 = uVar32;
        *(undefined2 *)(*pauVar9 + 2) = uVar32;
        *(undefined2 *)(*pauVar9 + 4) = uVar32;
        *(undefined2 *)(*pauVar9 + 6) = uVar32;
        *(undefined2 *)(*pauVar9 + 8) = uVar32;
        *(undefined2 *)(*pauVar9 + 10) = uVar32;
        *(undefined2 *)(*pauVar9 + 0xc) = uVar32;
        *(undefined2 *)(*pauVar9 + 0xe) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x10) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x12) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x14) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x16) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x18) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x1a) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x1c) = uVar32;
        *(undefined2 *)(*pauVar9 + 0x1e) = uVar32;
        stride = iVar31;
      }
      else {
        if (local_5b4 <= (int)uVar23) {
          iVar16 = iVar16 + -7;
          pauVar9 = (undefined1 (*) [32])local_320;
          iVar11 = -7;
          while( true ) {
            iVar24 = iVar29;
            if (iVar16 < iVar29) {
              iVar24 = iVar16;
            }
            if (iVar16 < 0) {
              iVar24 = iVar17;
            }
            if (iVar65 < iVar11) break;
            uVar32 = (undefined2)
                     ((uint)*(byte *)((long)*palVar18 + (long)(iVar24 * stride + iVar7)) * iVar6 +
                     iVar30);
            iVar24 = iVar16 + 1;
            if (iVar29 <= iVar16 + 1) {
              iVar24 = iVar29;
            }
            if (iVar16 < -1) {
              iVar24 = iVar17;
            }
            auVar42._0_2_ =
                 (undefined2)
                 ((uint)*(byte *)((long)*palVar18 + (long)(iVar24 * stride + iVar7)) * iVar6 +
                 iVar30);
            auVar42._2_2_ = auVar42._0_2_;
            auVar42._4_2_ = auVar42._0_2_;
            auVar42._6_2_ = auVar42._0_2_;
            auVar42._8_2_ = auVar42._0_2_;
            auVar42._10_2_ = auVar42._0_2_;
            auVar42._12_2_ = auVar42._0_2_;
            auVar42._14_2_ = auVar42._0_2_;
            auVar42._16_2_ = auVar42._0_2_;
            auVar42._18_2_ = auVar42._0_2_;
            auVar42._20_2_ = auVar42._0_2_;
            auVar42._22_2_ = auVar42._0_2_;
            auVar42._24_2_ = auVar42._0_2_;
            auVar42._26_2_ = auVar42._0_2_;
            auVar42._28_2_ = auVar42._0_2_;
            auVar42._30_2_ = auVar42._0_2_;
            auVar34 = vpblendd_avx2(ZEXT1632(CONCAT214(uVar32,CONCAT212(uVar32,CONCAT210(uVar32,
                                                  CONCAT28(uVar32,CONCAT26(uVar32,CONCAT24(uVar32,
                                                  CONCAT22(uVar32,uVar32)))))))),auVar42,0xf0);
            *pauVar9 = auVar34;
            iVar11 = iVar11 + 2;
            pauVar9 = pauVar9 + 1;
            iVar16 = iVar16 + 2;
          }
          bVar10 = *(byte *)((long)*palVar18 + (long)(iVar24 * stride + iVar7));
          goto LAB_003d57ac;
        }
        uVar26 = ((uint)uVar25 & 0xfffc) - local_5b8 & 0xffffffc0;
        local_620._0_8_ = uVar25 >> 0x10;
        if ((int)local_5a8 < (int)(uVar23 + 9) || (int)uVar23 < 7) {
          uVar22 = (uVar23 - (int)local_5a8) + 8;
          local_3f0 = (long)(int)uVar23;
          local_440 = ref + local_3f0 + -7;
          local_5a0 = warp_pad_left + (6 - uVar23);
          local_600 = warp_pad_right + uVar22;
          iVar17 = uVar26 + iVar15;
          iVar16 = iVar16 + -7;
          iVar11 = 0;
          iVar29 = -7;
          while( true ) {
            iVar24 = iVar66;
            if (iVar16 < iVar66) {
              iVar24 = iVar16;
            }
            if (iVar16 < 0) {
              iVar24 = 0;
            }
            if (iVar65 < iVar29) break;
            iVar12 = iVar16 + 1;
            if (iVar66 <= iVar16 + 1) {
              iVar12 = iVar66;
            }
            if (iVar16 < -1) {
              iVar12 = 0;
            }
            auVar33 = *(undefined1 (*) [16])(local_440 + iVar24 * iVar31);
            auVar39 = *(undefined1 (*) [16])(local_440 + iVar12 * iVar31);
            if ((int)local_620._0_4_ < 7) {
              auVar33 = vpshufb_avx(auVar33,(undefined1  [16])*local_5a0);
              auVar39 = vpshufb_avx(auVar39,(undefined1  [16])*local_5a0);
            }
            if (-1 < (int)uVar22) {
              vpshufb_avx(auVar33,(undefined1  [16])*local_600);
              vpshufb_avx(auVar39,(undefined1  [16])*local_600);
            }
            src[1] = (longlong)local_630;
            src[0] = (longlong)&local_460;
            src[2]._0_4_ = in_stack_fffffffffffff960;
            src[2]._4_4_ = iVar31;
            src[3]._0_4_ = iVar65;
            src[3]._4_1_ = cVar20;
            src[3]._5_1_ = cVar14;
            src[3]._6_1_ = cVar21;
            src[3]._7_1_ = cVar19;
            palVar18 = round_const_00;
            horizontal_filter_avx2
                      (src,&local_320,iVar17,alpha_00,(int)local_5f8,iVar11,(__m256i *)local_1e0,
                       round_const_00,(__m128i *)CONCAT44(iVar66,in_stack_fffffffffffff978));
            iVar11 = iVar11 + 1;
            iVar29 = iVar29 + 2;
            iVar17 = iVar17 + iVar4;
            iVar16 = iVar16 + 2;
            round_const_00 = palVar18;
          }
          auVar33 = *(undefined1 (*) [16])((long)palVar18[-1] + local_3f0 + iVar24 * iVar31 + 0x19);
          if ((int)local_620._0_4_ < 7) {
            auVar33 = vpshufb_avx(auVar33,(undefined1  [16])*local_5a0);
          }
          if (-1 < (int)uVar22) {
            auVar33 = vpshufb_avx(auVar33,(undefined1  [16])*local_600);
          }
          local_620._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar33;
          local_620._16_16_ = ZEXT116(1) * auVar33;
          prepare_horizontal_filter_coeff(alpha_00,iVar17,&local_560);
          src_02[0]._4_4_ = iVar31;
          src_02[0]._0_4_ = in_stack_fffffffffffff960;
          src_02[1]._0_4_ = iVar65;
          src_02[1]._4_1_ = cVar20;
          src_02[1]._5_1_ = cVar14;
          src_02[1]._6_1_ = cVar21;
          src_02[1]._7_1_ = cVar19;
          src_02[2] = (longlong)round_const_00;
          src_02[3]._0_4_ = in_stack_fffffffffffff978;
          src_02[3]._4_4_ = iVar66;
          palVar18 = round_const_00;
          filter_src_pixels_avx2
                    (src_02,&local_320,&local_560,(__m256i *)local_1e0,(__m256i *)&local_460,
                     &local_630,iVar11);
          stride = iVar31;
          round_const_00 = palVar18;
        }
        else {
          iVar17 = uVar26 + 0x10200;
          if (local_5bc == 0) {
            iVar11 = 0;
            prepare_horizontal_filter_coeff_alpha0_avx2(0,iVar17,&local_560);
            uVar25 = CONCAT44(0,local_620._0_4_ & 0x7fffffff);
            local_620._0_8_ = uVar25;
            local_440 = ref + (uVar25 - 7);
            palVar18 = round_const_00;
            for (iVar29 = -7; round_const_00 = palVar18, iVar29 <= iVar65; iVar29 = iVar29 + 2) {
              src_03[0]._4_4_ = iVar31;
              src_03[0]._0_4_ = in_stack_fffffffffffff960;
              src_03[1]._0_4_ = iVar65;
              src_03[1]._4_1_ = cVar20;
              src_03[1]._5_1_ = cVar14;
              src_03[1]._6_1_ = cVar21;
              src_03[1]._7_1_ = cVar19;
              src_03[2] = (longlong)palVar18;
              src_03[3]._0_4_ = in_stack_fffffffffffff978;
              src_03[3]._4_4_ = iVar66;
              filter_src_pixels_avx2
                        (src_03,&local_320,&local_560,(__m256i *)local_1e0,(__m256i *)&local_460,
                         &local_630,iVar11);
              iVar11 = iVar11 + 1;
            }
          }
          else {
            palVar18 = round_const_00;
            if (cVar14 == '\0') {
              if (cVar20 == '\0') {
                local_620._0_8_ = ZEXT48(uVar23 & 0x7fffffff);
                local_440 = ref + (local_620._0_8_ - 7);
                iVar17 = uVar26 + iVar15;
                iVar16 = iVar16 + -7;
                iVar11 = 0;
                iVar29 = -7;
                stride = iVar31;
                while( true ) {
                  iVar24 = iVar66;
                  if (iVar16 < iVar66) {
                    iVar24 = iVar16;
                  }
                  if (iVar16 < 0) {
                    iVar24 = 0;
                  }
                  if (iVar65 < iVar29) break;
                  src_00[1] = (longlong)local_630;
                  src_00[0] = (longlong)&local_460;
                  src_00[2]._0_4_ = in_stack_fffffffffffff960;
                  src_00[2]._4_4_ = stride;
                  src_00[3]._0_4_ = iVar65;
                  src_00[3]._4_1_ = cVar20;
                  src_00[3]._5_1_ = cVar14;
                  src_00[3]._6_1_ = cVar21;
                  src_00[3]._7_1_ = cVar19;
                  horizontal_filter_avx2
                            (src_00,&local_320,iVar17,alpha_00,(int)local_5f8,iVar11,
                             (__m256i *)local_1e0,palVar18,
                             (__m128i *)CONCAT44(iVar66,in_stack_fffffffffffff978));
                  iVar11 = iVar11 + 1;
                  iVar29 = iVar29 + 2;
                  iVar17 = iVar17 + iVar4;
                  iVar16 = iVar16 + 2;
                }
                pauVar1 = (undefined1 (*) [16])
                          ((long)palVar18[-1] + local_620._0_8_ + (long)(iVar24 * iVar31) + 0x19);
                local_620._16_8_ = *(undefined8 *)*pauVar1;
                local_620._0_16_ = *pauVar1;
                local_620._24_8_ = *(undefined8 *)(*pauVar1 + 8);
                prepare_horizontal_filter_coeff(alpha_00,iVar17,&local_560);
                src_06[0]._4_4_ = stride;
                src_06[0]._0_4_ = in_stack_fffffffffffff960;
                src_06[1]._0_4_ = iVar65;
                src_06[1]._4_1_ = cVar20;
                src_06[1]._5_1_ = cVar14;
                src_06[1]._6_1_ = cVar21;
                src_06[1]._7_1_ = cVar19;
                src_06[2] = (longlong)palVar18;
                src_06[3]._0_4_ = in_stack_fffffffffffff978;
                src_06[3]._4_4_ = iVar66;
                filter_src_pixels_avx2
                          (src_06,&local_320,&local_560,(__m256i *)local_1e0,(__m256i *)&local_460,
                           &local_630,iVar11);
                round_const_00 = palVar18;
                goto LAB_003d57c8;
              }
              auVar33._8_8_ = 0;
              auVar33._0_8_ = av1_filter_8bit[iVar17 >> 10];
              auVar47._8_8_ = 0;
              auVar47._0_8_ = av1_filter_8bit[(int)local_400 + iVar17 >> 10];
              auVar33 = vpunpcklwd_avx(auVar33,auVar47);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = av1_filter_8bit[alpha_00 + iVar17 >> 10];
              auVar48._8_8_ = 0;
              auVar48._0_8_ = av1_filter_8bit[(int)local_408 + iVar17 >> 10];
              auVar39 = vpunpcklwd_avx(auVar39,auVar48);
              auVar49._8_8_ = 0;
              auVar49._0_8_ = av1_filter_8bit[(int)local_410 + iVar17 >> 10];
              auVar57._8_8_ = 0;
              auVar57._0_8_ = av1_filter_8bit[(int)local_3f8 + iVar17 >> 10];
              auVar47 = vpunpcklwd_avx(auVar49,auVar57);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = av1_filter_8bit[(int)local_418 + iVar17 >> 10];
              auVar58._8_8_ = 0;
              auVar58._0_8_ = av1_filter_8bit[iVar17 + local_5c0 >> 10];
              auVar48 = vpunpcklwd_avx(auVar55,auVar58);
              auVar38._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar33;
              auVar38._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar33
              ;
              auVar53._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar47;
              auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar47
              ;
              auVar42 = vpunpckldq_avx2(auVar38,auVar53);
              auVar34 = vpunpckhdq_avx2(auVar38,auVar53);
              auVar46._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar39;
              auVar46._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39
              ;
              auVar54._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar48;
              auVar54._16_16_ = ZEXT116(1) * auVar48;
              auVar38 = vpunpckldq_avx2(auVar46,auVar54);
              auVar40 = vpunpckhdq_avx2(auVar46,auVar54);
              local_560 = (__m256i)vpunpcklqdq_avx2(auVar42,auVar38);
              local_540 = vpunpckhqdq_avx2(auVar42,auVar38);
              local_520 = (__m256i)vpunpcklqdq_avx2(auVar34,auVar40);
              local_500 = vpunpckhqdq_avx2(auVar34,auVar40);
              local_620._0_8_ = CONCAT44(0,uVar23 & 0x7fffffff);
              local_440 = ref + (local_620._0_8_ - 7);
              iVar11 = 0;
              for (iVar29 = -7; round_const_00 = palVar18, iVar29 <= iVar65; iVar29 = iVar29 + 2) {
                src_04[0]._4_4_ = iVar31;
                src_04[0]._0_4_ = in_stack_fffffffffffff960;
                src_04[1]._0_4_ = iVar65;
                src_04[1]._4_1_ = cVar20;
                src_04[1]._5_1_ = cVar14;
                src_04[1]._6_1_ = cVar21;
                src_04[1]._7_1_ = cVar19;
                src_04[2] = (longlong)palVar18;
                src_04[3]._0_4_ = in_stack_fffffffffffff978;
                src_04[3]._4_4_ = iVar66;
                filter_src_pixels_avx2
                          (src_04,&local_320,&local_560,(__m256i *)local_1e0,(__m256i *)&local_460,
                           &local_630,iVar11);
                iVar11 = iVar11 + 1;
              }
            }
            else {
              local_620._0_8_ = ZEXT48(uVar23 & 0x7fffffff);
              local_600 = (uint8_t (*) [16])(ref + (local_620._0_8_ - 7));
              iVar24 = uVar26 + iVar15;
              iVar16 = iVar16 + -7;
              iVar11 = 0;
              iVar17 = -7;
              while( true ) {
                iVar12 = iVar29;
                if (iVar16 < iVar29) {
                  iVar12 = iVar16;
                }
                if (iVar16 < 0) {
                  iVar12 = 0;
                }
                if (iVar65 < iVar17) break;
                iVar13 = iVar16 + 1;
                if (iVar29 <= iVar16 + 1) {
                  iVar13 = iVar29;
                }
                local_440 = *(uint8_t **)(*local_600 + iVar12 * stride);
                uStack_438 = *(undefined8 *)(*local_600 + iVar12 * stride + 8);
                if (iVar16 < -1) {
                  iVar13 = 0;
                }
                uStack_430 = *(undefined8 *)(*local_600 + iVar13 * stride);
                uStack_428 = *(undefined8 *)(*local_600 + iVar13 * stride + 8);
                iVar29 = iVar66;
                prepare_horizontal_filter_coeff_alpha0_avx2((int)local_5f8,iVar24,&local_560);
                src_01[0]._4_4_ = iVar31;
                src_01[0]._0_4_ = in_stack_fffffffffffff960;
                src_01[1]._0_4_ = iVar65;
                src_01[1]._4_1_ = cVar20;
                src_01[1]._5_1_ = cVar14;
                src_01[1]._6_1_ = cVar21;
                src_01[1]._7_1_ = cVar19;
                src_01[2] = (longlong)palVar18;
                src_01[3]._0_4_ = in_stack_fffffffffffff978;
                src_01[3]._4_4_ = iVar29;
                stride = iVar31;
                iVar66 = iVar29;
                filter_src_pixels_avx2
                          (src_01,&local_320,&local_560,(__m256i *)local_1e0,(__m256i *)&local_460,
                           &local_630,iVar11);
                iVar11 = iVar11 + 1;
                iVar17 = iVar17 + 2;
                iVar24 = iVar24 + iVar4;
                iVar16 = iVar16 + 2;
                iVar31 = stride;
              }
              pauVar1 = (undefined1 (*) [16])
                        ((long)palVar18[-1] + local_620._0_8_ + (long)(iVar12 * stride) + 0x19);
              local_620._16_8_ = *(undefined8 *)*pauVar1;
              local_620._0_16_ = *pauVar1;
              local_620._24_8_ = *(undefined8 *)(*pauVar1 + 8);
              round_const_00 = palVar18;
              prepare_horizontal_filter_coeff_alpha0_avx2((int)local_5f8,iVar24,&local_560);
            }
          }
          src_05[0]._4_4_ = iVar31;
          src_05[0]._0_4_ = in_stack_fffffffffffff960;
          src_05[1]._0_4_ = iVar65;
          src_05[1]._4_1_ = cVar20;
          src_05[1]._5_1_ = cVar14;
          src_05[1]._6_1_ = cVar21;
          src_05[1]._7_1_ = cVar19;
          src_05[2] = (longlong)round_const_00;
          src_05[3]._0_4_ = in_stack_fffffffffffff978;
          src_05[3]._4_4_ = iVar66;
          filter_src_pixels_avx2
                    (src_05,&local_320,&local_560,(__m256i *)local_1e0,(__m256i *)&local_460,
                     &local_630,iVar11);
          stride = iVar31;
        }
      }
LAB_003d57c8:
      iVar31 = (((uint)lVar8 & 0xfffc) - local_5b0 & 0xffffffc0) + 0x10200;
      if ((short)local_5ac == 0) {
        auVar34 = vperm2i128_avx2((undefined1  [32])local_320,local_300,0x21);
        auVar40 = vperm2i128_avx2(local_300,local_2e0,0x21);
        auVar42 = vperm2i128_avx2(local_2e0,local_2c0,0x21);
        local_560 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_320,auVar34);
        local_520 = (__m256i)vpunpcklwd_avx2(local_300,auVar40);
        local_4e0 = (__m256i)vpunpcklwd_avx2(local_2e0,auVar42);
        local_540 = vpunpckhwd_avx2((undefined1  [32])local_320,auVar34);
        local_500 = vpunpckhwd_avx2(local_300,auVar40);
        local_4c0 = vpunpckhwd_avx2(local_2e0,auVar42);
        prepare_vertical_filter_coeffs_gamma0_avx2((int)local_5c8,iVar31,&local_160);
        iVar31 = 0;
        palVar18 = round_const_00;
        for (iVar17 = -4; round_const_00 = palVar18, iVar29 = iVar66, iVar17 < iVar28;
            iVar17 = iVar17 + 2) {
          filter_src_pixels_vertical_avx2
                    (&local_320,&local_560,&local_160,&local_200,&local_220,iVar31);
          store_vertical_filter_output_avx2
                    (&local_200,&local_220,(__m256i *)&local_3a0,&local_380,(__m256i *)&local_340,
                     (__m256i *)&local_360,local_5e0,conv_params,i,j,iVar17,(int)local_5f0,p_stride,
                     p_width,(int)local_5e8);
          local_540 = local_500;
          alVar3[0] = local_4e0[0];
          alVar3[1] = local_4e0[1];
          alVar3[2] = local_4e0[2];
          alVar3[3] = local_4e0[3];
          local_560[0] = local_520[0];
          local_560[1] = local_520[1];
          local_560[2] = local_520[2];
          local_560[3] = local_520[3];
          local_4e0[1] = uStack_498;
          local_4e0[0] = local_4a0;
          local_4e0[2] = uStack_490;
          local_4e0[3] = lStack_488;
          local_500 = local_4c0;
          local_4c0 = local_480;
          iVar31 = iVar31 + 1;
          local_520 = alVar3;
        }
      }
      else if (cVar19 == '\0') {
        if (cVar21 == '\0') {
          auVar34 = vperm2i128_avx2((undefined1  [32])local_320,local_300,0x21);
          auVar40 = vperm2i128_avx2(local_300,local_2e0,0x21);
          auVar42 = vperm2i128_avx2(local_2e0,local_2c0,0x21);
          local_560 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_320,auVar34);
          local_520 = (__m256i)vpunpcklwd_avx2(local_300,auVar40);
          local_4e0 = (__m256i)vpunpcklwd_avx2(local_2e0,auVar42);
          local_540 = vpunpckhwd_avx2((undefined1  [32])local_320,auVar34);
          local_500 = vpunpckhwd_avx2(local_300,auVar40);
          local_4c0 = vpunpckhwd_avx2(local_2e0,auVar42);
          iVar16 = 0;
          for (iVar17 = -4; iVar29 = iVar66, iVar17 < iVar28; iVar17 = iVar17 + 2) {
            auVar37._16_16_ = (undefined1  [16])av1_warped_filter[(int)local_5c8 + iVar31 >> 10];
            auVar37._0_16_ = (undefined1  [16])av1_warped_filter[iVar31 >> 10];
            auVar45._16_16_ = (undefined1  [16])av1_warped_filter[(int)local_3d8 + iVar31 >> 10];
            auVar45._0_16_ = (undefined1  [16])av1_warped_filter[(int)local_570 + iVar31 >> 10];
            auVar52._16_16_ = (undefined1  [16])av1_warped_filter[(int)local_3d0 + iVar31 >> 10];
            auVar52._0_16_ = (undefined1  [16])av1_warped_filter[(int)local_578 + iVar31 >> 10];
            auVar56._16_16_ = (undefined1  [16])av1_warped_filter[(int)local_3c8 + iVar31 >> 10];
            auVar56._0_16_ = (undefined1  [16])av1_warped_filter[(int)local_580 + iVar31 >> 10];
            auVar61._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[(int)local_3a8 + iVar31 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_568 + iVar31 >> 10];
            auVar61._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_3a8 + iVar31 >> 10];
            auVar62._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[(int)local_3c0 + iVar31 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_588 + iVar31 >> 10];
            auVar62._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_3c0 + iVar31 >> 10];
            auVar63._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[(int)local_3b8 + iVar31 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_590 + iVar31 >> 10];
            auVar63._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_3b8 + iVar31 >> 10];
            auVar64._0_16_ =
                 ZEXT116(0) * (undefined1  [16])av1_warped_filter[(int)local_3b0 + iVar31 >> 10] +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_598 + iVar31 >> 10];
            auVar64._16_16_ =
                 ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                 ZEXT116(1) * (undefined1  [16])av1_warped_filter[(int)local_3b0 + iVar31 >> 10];
            auVar42 = vunpcklps_avx(auVar37,auVar45);
            auVar34 = vunpckhps_avx(auVar37,auVar45);
            auVar38 = vunpcklps_avx(auVar52,auVar56);
            auVar40 = vunpckhps_avx(auVar52,auVar56);
            local_160 = (__m256i)vunpcklpd_avx(auVar42,auVar38);
            local_140 = vunpckhpd_avx(auVar42,auVar38);
            local_120 = vunpcklpd_avx(auVar34,auVar40);
            local_100 = vunpckhpd_avx(auVar34,auVar40);
            auVar42 = vpunpckldq_avx2(auVar61,auVar62);
            auVar38 = vpunpckldq_avx2(auVar63,auVar64);
            auVar34 = vpunpckhdq_avx2(auVar61,auVar62);
            auVar40 = vpunpckhdq_avx2(auVar63,auVar64);
            local_e0 = vpunpcklqdq_avx2(auVar42,auVar38);
            local_c0 = vpunpckhqdq_avx2(auVar42,auVar38);
            local_a0 = vpunpcklqdq_avx2(auVar34,auVar40);
            local_80 = vpunpckhqdq_avx2(auVar34,auVar40);
            palVar18 = round_const_00;
            filter_src_pixels_vertical_avx2
                      (&local_320,&local_560,&local_160,&local_200,&local_220,iVar16);
            store_vertical_filter_output_avx2
                      (&local_200,&local_220,(__m256i *)&local_3a0,&local_380,(__m256i *)&local_340,
                       (__m256i *)&local_360,local_5e0,conv_params,i,j,iVar17,(int)local_5f0,
                       p_stride,p_width,(int)local_5e8);
            local_560[0] = local_520[0];
            local_560[1] = local_520[1];
            local_560[2] = local_520[2];
            local_560[3] = local_520[3];
            local_520[0] = local_4e0[0];
            local_520[1] = local_4e0[1];
            local_520[2] = local_4e0[2];
            local_520[3] = local_4e0[3];
            local_4e0[1] = uStack_498;
            local_4e0[0] = local_4a0;
            local_4e0[2] = uStack_490;
            local_4e0[3] = lStack_488;
            local_540 = local_500;
            local_500 = local_4c0;
            local_4c0 = local_480;
            iVar16 = iVar16 + 1;
            iVar31 = iVar31 + uVar27 * 2;
            round_const_00 = palVar18;
          }
        }
        else {
          auVar34 = vperm2i128_avx2((undefined1  [32])local_320,local_300,0x21);
          auVar40 = vperm2i128_avx2(local_300,local_2e0,0x21);
          auVar42 = vperm2i128_avx2(local_2e0,local_2c0,0x21);
          local_560 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_320,auVar34);
          local_520 = (__m256i)vpunpcklwd_avx2(local_300,auVar40);
          local_4e0 = (__m256i)vpunpcklwd_avx2(local_2e0,auVar42);
          local_540 = vpunpckhwd_avx2((undefined1  [32])local_320,auVar34);
          local_500 = vpunpckhwd_avx2(local_300,auVar40);
          local_4c0 = vpunpckhwd_avx2(local_2e0,auVar42);
          aWVar2 = av1_warped_filter[iVar31 >> 10];
          auVar35._16_2_ = aWVar2[0];
          auVar35._18_2_ = aWVar2[1];
          auVar35._20_2_ = aWVar2[2];
          auVar35._22_2_ = aWVar2[3];
          auVar35._24_2_ = aWVar2[4];
          auVar35._26_2_ = aWVar2[5];
          auVar35._28_2_ = aWVar2[6];
          auVar35._30_2_ = aWVar2[7];
          auVar35._0_2_ = aWVar2[0];
          auVar35._2_2_ = aWVar2[1];
          auVar35._4_2_ = aWVar2[2];
          auVar35._6_2_ = aWVar2[3];
          auVar35._8_2_ = aWVar2[4];
          auVar35._10_2_ = aWVar2[5];
          auVar35._12_2_ = aWVar2[6];
          auVar35._14_2_ = aWVar2[7];
          aWVar2 = av1_warped_filter[(int)local_570 + iVar31 >> 10];
          auVar43._16_2_ = aWVar2[0];
          auVar43._18_2_ = aWVar2[1];
          auVar43._20_2_ = aWVar2[2];
          auVar43._22_2_ = aWVar2[3];
          auVar43._24_2_ = aWVar2[4];
          auVar43._26_2_ = aWVar2[5];
          auVar43._28_2_ = aWVar2[6];
          auVar43._30_2_ = aWVar2[7];
          auVar43._0_2_ = aWVar2[0];
          auVar43._2_2_ = aWVar2[1];
          auVar43._4_2_ = aWVar2[2];
          auVar43._6_2_ = aWVar2[3];
          auVar43._8_2_ = aWVar2[4];
          auVar43._10_2_ = aWVar2[5];
          auVar43._12_2_ = aWVar2[6];
          auVar43._14_2_ = aWVar2[7];
          aWVar2 = av1_warped_filter[(int)local_578 + iVar31 >> 10];
          auVar50._16_2_ = aWVar2[0];
          auVar50._18_2_ = aWVar2[1];
          auVar50._20_2_ = aWVar2[2];
          auVar50._22_2_ = aWVar2[3];
          auVar50._24_2_ = aWVar2[4];
          auVar50._26_2_ = aWVar2[5];
          auVar50._28_2_ = aWVar2[6];
          auVar50._30_2_ = aWVar2[7];
          auVar50._0_2_ = aWVar2[0];
          auVar50._2_2_ = aWVar2[1];
          auVar50._4_2_ = aWVar2[2];
          auVar50._6_2_ = aWVar2[3];
          auVar50._8_2_ = aWVar2[4];
          auVar50._10_2_ = aWVar2[5];
          auVar50._12_2_ = aWVar2[6];
          auVar50._14_2_ = aWVar2[7];
          auVar42 = vunpcklps_avx(auVar35,auVar43);
          aWVar2 = av1_warped_filter[(int)local_580 + iVar31 >> 10];
          auVar59._16_2_ = aWVar2[0];
          auVar59._18_2_ = aWVar2[1];
          auVar59._20_2_ = aWVar2[2];
          auVar59._22_2_ = aWVar2[3];
          auVar59._24_2_ = aWVar2[4];
          auVar59._26_2_ = aWVar2[5];
          auVar59._28_2_ = aWVar2[6];
          auVar59._30_2_ = aWVar2[7];
          auVar59._0_2_ = aWVar2[0];
          auVar59._2_2_ = aWVar2[1];
          auVar59._4_2_ = aWVar2[2];
          auVar59._6_2_ = aWVar2[3];
          auVar59._8_2_ = aWVar2[4];
          auVar59._10_2_ = aWVar2[5];
          auVar59._12_2_ = aWVar2[6];
          auVar59._14_2_ = aWVar2[7];
          auVar38 = vunpcklps_avx(auVar50,auVar59);
          auVar34 = vunpckhps_avx(auVar35,auVar43);
          auVar40 = vunpckhps_avx(auVar50,auVar59);
          local_160 = (__m256i)vunpcklpd_avx(auVar42,auVar38);
          local_140 = vunpckhpd_avx(auVar42,auVar38);
          local_120 = vunpcklpd_avx(auVar34,auVar40);
          local_100 = vunpckhpd_avx(auVar34,auVar40);
          aWVar2 = av1_warped_filter[(int)local_568 + iVar31 >> 10];
          auVar36._16_2_ = aWVar2[0];
          auVar36._18_2_ = aWVar2[1];
          auVar36._20_2_ = aWVar2[2];
          auVar36._22_2_ = aWVar2[3];
          auVar36._24_2_ = aWVar2[4];
          auVar36._26_2_ = aWVar2[5];
          auVar36._28_2_ = aWVar2[6];
          auVar36._30_2_ = aWVar2[7];
          auVar36._0_2_ = aWVar2[0];
          auVar36._2_2_ = aWVar2[1];
          auVar36._4_2_ = aWVar2[2];
          auVar36._6_2_ = aWVar2[3];
          auVar36._8_2_ = aWVar2[4];
          auVar36._10_2_ = aWVar2[5];
          auVar36._12_2_ = aWVar2[6];
          auVar36._14_2_ = aWVar2[7];
          aWVar2 = av1_warped_filter[(int)local_588 + iVar31 >> 10];
          auVar44._16_2_ = aWVar2[0];
          auVar44._18_2_ = aWVar2[1];
          auVar44._20_2_ = aWVar2[2];
          auVar44._22_2_ = aWVar2[3];
          auVar44._24_2_ = aWVar2[4];
          auVar44._26_2_ = aWVar2[5];
          auVar44._28_2_ = aWVar2[6];
          auVar44._30_2_ = aWVar2[7];
          auVar44._0_2_ = aWVar2[0];
          auVar44._2_2_ = aWVar2[1];
          auVar44._4_2_ = aWVar2[2];
          auVar44._6_2_ = aWVar2[3];
          auVar44._8_2_ = aWVar2[4];
          auVar44._10_2_ = aWVar2[5];
          auVar44._12_2_ = aWVar2[6];
          auVar44._14_2_ = aWVar2[7];
          aWVar2 = av1_warped_filter[(int)local_590 + iVar31 >> 10];
          auVar51._16_2_ = aWVar2[0];
          auVar51._18_2_ = aWVar2[1];
          auVar51._20_2_ = aWVar2[2];
          auVar51._22_2_ = aWVar2[3];
          auVar51._24_2_ = aWVar2[4];
          auVar51._26_2_ = aWVar2[5];
          auVar51._28_2_ = aWVar2[6];
          auVar51._30_2_ = aWVar2[7];
          auVar51._0_2_ = aWVar2[0];
          auVar51._2_2_ = aWVar2[1];
          auVar51._4_2_ = aWVar2[2];
          auVar51._6_2_ = aWVar2[3];
          auVar51._8_2_ = aWVar2[4];
          auVar51._10_2_ = aWVar2[5];
          auVar51._12_2_ = aWVar2[6];
          auVar51._14_2_ = aWVar2[7];
          auVar42 = vpunpckldq_avx2(auVar36,auVar44);
          aWVar2 = av1_warped_filter[iVar31 + (int)local_598 >> 10];
          auVar60._16_2_ = aWVar2[0];
          auVar60._18_2_ = aWVar2[1];
          auVar60._20_2_ = aWVar2[2];
          auVar60._22_2_ = aWVar2[3];
          auVar60._24_2_ = aWVar2[4];
          auVar60._26_2_ = aWVar2[5];
          auVar60._28_2_ = aWVar2[6];
          auVar60._30_2_ = aWVar2[7];
          auVar60._0_2_ = aWVar2[0];
          auVar60._2_2_ = aWVar2[1];
          auVar60._4_2_ = aWVar2[2];
          auVar60._6_2_ = aWVar2[3];
          auVar60._8_2_ = aWVar2[4];
          auVar60._10_2_ = aWVar2[5];
          auVar60._12_2_ = aWVar2[6];
          auVar60._14_2_ = aWVar2[7];
          auVar38 = vpunpckldq_avx2(auVar51,auVar60);
          auVar34 = vpunpckhdq_avx2(auVar36,auVar44);
          auVar40 = vpunpckhdq_avx2(auVar51,auVar60);
          local_e0 = vpunpcklqdq_avx2(auVar42,auVar38);
          local_c0 = vpunpckhqdq_avx2(auVar42,auVar38);
          local_a0 = vpunpcklqdq_avx2(auVar34,auVar40);
          local_80 = vpunpckhqdq_avx2(auVar34,auVar40);
          iVar31 = 0;
          for (iVar17 = -4; iVar29 = iVar66, iVar17 < iVar28; iVar17 = iVar17 + 2) {
            filter_src_pixels_vertical_avx2
                      (&local_320,&local_560,&local_160,&local_200,&local_220,iVar31);
            palVar18 = round_const_00;
            store_vertical_filter_output_avx2
                      (&local_200,&local_220,(__m256i *)&local_3a0,&local_380,(__m256i *)&local_340,
                       (__m256i *)&local_360,local_5e0,conv_params,i,j,iVar17,(int)local_5f0,
                       p_stride,p_width,(int)local_5e8);
            local_560[0] = local_520[0];
            local_560[1] = local_520[1];
            local_560[2] = local_520[2];
            local_560[3] = local_520[3];
            local_520[0] = local_4e0[0];
            local_520[1] = local_4e0[1];
            local_520[2] = local_4e0[2];
            local_520[3] = local_4e0[3];
            local_4e0[1] = uStack_498;
            local_4e0[0] = local_4a0;
            local_4e0[2] = uStack_490;
            local_4e0[3] = lStack_488;
            local_540 = local_500;
            local_500 = local_4c0;
            local_4c0 = local_480;
            iVar31 = iVar31 + 1;
            round_const_00 = palVar18;
          }
        }
      }
      else {
        auVar34 = vperm2i128_avx2((undefined1  [32])local_320,local_300,0x21);
        auVar40 = vperm2i128_avx2(local_300,local_2e0,0x21);
        auVar42 = vperm2i128_avx2(local_2e0,local_2c0,0x21);
        local_560 = (__m256i)vpunpcklwd_avx2((undefined1  [32])local_320,auVar34);
        local_520 = (__m256i)vpunpcklwd_avx2(local_300,auVar40);
        local_4e0 = (__m256i)vpunpcklwd_avx2(local_2e0,auVar42);
        local_540 = vpunpckhwd_avx2((undefined1  [32])local_320,auVar34);
        local_500 = vpunpckhwd_avx2(local_300,auVar40);
        local_4c0 = vpunpckhwd_avx2(local_2e0,auVar42);
        iVar16 = 0;
        for (iVar17 = -4; iVar29 = iVar66, iVar17 < iVar28; iVar17 = iVar17 + 2) {
          prepare_vertical_filter_coeffs_gamma0_avx2((int)local_5c8,iVar31,&local_160);
          filter_src_pixels_vertical_avx2
                    (&local_320,&local_560,&local_160,&local_200,&local_220,iVar16);
          palVar18 = round_const_00;
          store_vertical_filter_output_avx2
                    (&local_200,&local_220,(__m256i *)&local_3a0,&local_380,(__m256i *)&local_340,
                     (__m256i *)&local_360,local_5e0,conv_params,i,j,iVar17,(int)local_5f0,p_stride,
                     p_width,(int)local_5e8);
          local_560[0] = local_520[0];
          local_560[1] = local_520[1];
          local_560[2] = local_520[2];
          local_560[3] = local_520[3];
          local_520[0] = local_4e0[0];
          local_520[1] = local_4e0[1];
          local_520[2] = local_4e0[2];
          local_520[3] = local_4e0[3];
          local_4e0[1] = uStack_498;
          local_4e0[0] = local_4a0;
          local_4e0[2] = uStack_490;
          local_4e0[3] = lStack_488;
          local_540 = local_500;
          local_500 = local_4c0;
          local_4c0 = local_480;
          iVar16 = iVar16 + 1;
          iVar31 = iVar31 + uVar27 * 2;
          round_const_00 = palVar18;
        }
      }
      iVar31 = stride;
      iVar66 = iVar29;
    }
    i = i + 8;
  } while( true );
}

Assistant:

void av1_warp_affine_avx2(const int32_t *mat, const uint8_t *ref, int width,
                          int height, int stride, uint8_t *pred, int p_col,
                          int p_row, int p_width, int p_height, int p_stride,
                          int subsampling_x, int subsampling_y,
                          ConvolveParams *conv_params, int16_t alpha,
                          int16_t beta, int16_t gamma, int16_t delta) {
  __m256i horz_out[8];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  const __m256i round_const = _mm256_set1_epi16(
      (1 << offset_bits_horiz) + ((1 << reduce_bits_horiz) >> 1));
  const __m128i shift = _mm_cvtsi32_si128(reduce_bits_horiz);

  __m256i res_sub_const, round_bits_const, wt;
  unpack_weights_and_set_round_const_avx2(conv_params, round_bits, offset_bits,
                                          &res_sub_const, &round_bits_const,
                                          &wt);

  __m256i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm256_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                        ((1 << reduce_bits_vert) >> 1));
  }
  const int32_t const1 = alpha * (-4) + beta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const2 = gamma * (-4) + delta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const3 = ((1 << WARP_PARAM_REDUCE_BITS) - 1);
  const int16_t const4 = (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1));
  const int16_t const5 = (1 << (FILTER_BITS - reduce_bits_horiz));

  __m256i shuffle_src[4];
  shuffle_src[0] = _mm256_load_si256((__m256i *)shuffle_src0);
  shuffle_src[1] = _mm256_load_si256((__m256i *)shuffle_src1);
  shuffle_src[2] = _mm256_load_si256((__m256i *)shuffle_src2);
  shuffle_src[3] = _mm256_load_si256((__m256i *)shuffle_src3);

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += const1;
      sy4 += const2;

      sx4 &= ~const3;
      sy4 &= ~const3;

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.

      if (ix4 <= -7) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] = _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
      } else if (ix4 >= width + 6) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] =
            _mm256_set1_epi16(const4 + ref[iy * stride + (width - 1)] * const5);
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        int iy, sx, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          __m128i src0 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          __m128i src1 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_left);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_right);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_right);
          }
          sx = sx4 + beta * (k + 4);
          const __m256i src_01 =
              _mm256_inserti128_si256(_mm256_castsi128_si256(src0), src1, 0x1);
          horizontal_filter_avx2(src_01, horz_out, sx, alpha, beta, row,
                                 shuffle_src, &round_const, &shift);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        __m128i src = _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
        if (out_of_boundary_left >= 0) {
          const __m128i shuffle_reg_left =
              _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
          src = _mm_shuffle_epi8(src, shuffle_reg_left);
        }
        if (out_of_boundary_right >= 0) {
          const __m128i shuffle_reg_right =
              _mm_loadu_si128((__m128i *)warp_pad_right[out_of_boundary_right]);
          src = _mm_shuffle_epi8(src, shuffle_reg_right);
        }
        sx = sx4 + beta * (k + 4);
        const __m256i src_01 = _mm256_castsi128_si256(src);
        __m256i coeff[4];
        prepare_horizontal_filter_coeff(alpha, sx, coeff);
        filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src,
                               &round_const, &shift, row);
      } else {
        prepare_warp_horizontal_filter_avx2(
            ref, horz_out, stride, ix4, iy4, sx4, alpha, beta, p_height, height,
            i, &round_const, &shift, shuffle_src);
      }

      // Vertical filter
      prepare_warp_vertical_filter_avx2(
          pred, horz_out, conv_params, gamma, delta, p_height, p_stride,
          p_width, i, j, sy4, reduce_bits_vert, &res_add_const_1, round_bits,
          &res_sub_const, &round_bits_const, &wt);
    }
  }
}